

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_dump(lua_State *L)

{
  int strip_00;
  int iVar1;
  bool bVar2;
  undefined4 local_438;
  int strip;
  str_Writer state;
  lua_State *L_local;
  
  state.B.init._1016_8_ = L;
  strip_00 = lua_toboolean(L,2);
  iVar1 = lua_type((lua_State *)state.B.init._1016_8_,1);
  bVar2 = false;
  if (iVar1 == 6) {
    iVar1 = lua_iscfunction((lua_State *)state.B.init._1016_8_,1);
    bVar2 = iVar1 == 0;
  }
  if (!bVar2) {
    luaL_argerror((lua_State *)state.B.init._1016_8_,1,"Lua function expected");
  }
  lua_pushvalue((lua_State *)state.B.init._1016_8_,1);
  local_438 = 0;
  lua_dump((lua_State *)state.B.init._1016_8_,writer,&local_438,strip_00);
  lua_settop((lua_State *)state.B.init._1016_8_,1);
  return 1;
}

Assistant:

static int str_dump (lua_State *L) {
  struct str_Writer state;
  int strip = lua_toboolean(L, 2);
  luaL_argcheck(L, lua_type(L, 1) == LUA_TFUNCTION && !lua_iscfunction(L, 1),
                   1, "Lua function expected");
  /* ensure function is on the top of the stack and vacate slot 1 */
  lua_pushvalue(L, 1);
  state.init = 0;
  lua_dump(L, writer, &state, strip);
  lua_settop(L, 1);  /* leave final result on top */
  return 1;
}